

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

void __thiscall SFFile::SetOrder(SFFile *this,int order,int drum,int bank,int program)

{
  SFPerc *pSVar1;
  int local_28;
  int local_24;
  int i_1;
  int i;
  int program_local;
  int bank_local;
  int drum_local;
  int order_local;
  SFFile *this_local;
  
  if (drum == 0) {
    for (local_28 = 0; local_28 < this->NumPresets; local_28 = local_28 + 1) {
      if (((uint)this->Presets[local_28].Program == program) &&
         ((uint)this->Presets[local_28].Bank == bank)) {
        this->Presets[local_28].field_0x15 =
             this->Presets[local_28].field_0x15 & 0x80 | (byte)order & 0x7f;
      }
    }
  }
  else {
    for (local_24 = 0; local_24 < this->NumPresets; local_24 = local_24 + 1) {
      pSVar1 = TArray<SFPerc,_SFPerc>::operator[](&this->Percussion,(long)local_24);
      if (((uint)(pSVar1->Generators).field_0.keyRange.Lo == bank) &&
         (pSVar1 = TArray<SFPerc,_SFPerc>::operator[](&this->Percussion,(long)local_24),
         (uint)(pSVar1->Generators).field_0.keyRange.Hi == program)) {
        pSVar1 = TArray<SFPerc,_SFPerc>::operator[](&this->Percussion,(long)local_24);
        pSVar1->LoadOrder = (byte)order;
      }
    }
  }
  return;
}

Assistant:

void SFFile::SetOrder(int order, int drum, int bank, int program)
{
	if (drum)
	{
		for (int i = 0; i < NumPresets; ++i)
		{
			if (Percussion[i].Generators.drumset == bank && Percussion[i].Generators.key == program)
			{
				Percussion[i].LoadOrder = order;
			}
		}
	}
	else
	{
		for (int i = 0; i < NumPresets; ++i)
		{
			if (Presets[i].Program == program && Presets[i].Bank == bank)
			{
				Presets[i].LoadOrder = order;
			}
		}
	}
}